

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O1

void __thiscall ipx::Basis::SetToSlackBasis(Basis *this)

{
  int iVar1;
  uint uVar2;
  pointer piVar3;
  undefined1 auVar4 [16];
  long lVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar4 = _DAT_003c57d0;
  iVar1 = this->model_->num_rows_;
  lVar8 = (long)iVar1;
  uVar2 = this->model_->num_cols_;
  if (0 < lVar8) {
    piVar3 = (this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = lVar8 + -1;
    auVar9._8_4_ = (int)lVar5;
    auVar9._0_8_ = lVar5;
    auVar9._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar5 = 0;
    auVar9 = auVar9 ^ _DAT_003c57d0;
    uVar6 = (ulong)uVar2;
    auVar13 = _DAT_003c57c0;
    do {
      auVar12 = auVar13 ^ auVar4;
      iVar7 = (int)uVar6;
      if ((bool)(~(auVar12._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar12._0_4_ ||
                  auVar9._4_4_ < auVar12._4_4_) & 1)) {
        *(int *)((long)piVar3 + lVar5) = iVar7;
      }
      if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
          auVar12._12_4_ <= auVar9._12_4_) {
        *(int *)((long)piVar3 + lVar5 + 4) = iVar7 + 1;
      }
      lVar11 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 2;
      auVar13._8_8_ = lVar11 + 2;
      lVar5 = lVar5 + 8;
      uVar6 = (ulong)(iVar7 + 2);
    } while ((ulong)(iVar1 + 1U >> 1) << 3 != lVar5);
  }
  if (0 < (int)uVar2) {
    memset((this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start,0xff,(ulong)uVar2 * 4);
  }
  auVar4 = _DAT_003c57d0;
  if (0 < iVar1) {
    piVar3 = (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = lVar8 + -1;
    auVar10._8_4_ = (int)lVar8;
    auVar10._0_8_ = lVar8;
    auVar10._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar6 = 0;
    auVar10 = auVar10 ^ _DAT_003c57d0;
    auVar12 = _DAT_003c57c0;
    do {
      auVar13 = auVar12 ^ auVar4;
      if ((bool)(~(auVar13._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar13._0_4_ ||
                  auVar10._4_4_ < auVar13._4_4_) & 1)) {
        piVar3[(long)(int)uVar2 + uVar6] = (int)uVar6;
      }
      if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
          auVar13._12_4_ <= auVar10._12_4_) {
        piVar3[(long)(int)uVar2 + uVar6 + 1] = (int)uVar6 + 1;
      }
      uVar6 = uVar6 + 2;
      lVar8 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar8 + 2;
    } while ((iVar1 + 1U & 0xfffffffe) != uVar6);
  }
  Factorize(this);
  return;
}

Assistant:

void Basis::SetToSlackBasis() {
    const Int m = model_.rows();
    const Int n = model_.cols();
    for (Int i = 0; i < m; i++)
        basis_[i] = n+i;
    for (Int j = 0; j < n; j++)
        map2basis_[j] = -1;
    for (Int i = 0; i < m; i++)
        map2basis_[n+i] = i;
    Int err = Factorize();
    // factorization of slack basis cannot fail other than out of memory
    assert(err == 0);
}